

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.h
# Opt level: O0

void __thiscall VBitmap::Impl::Impl(Impl *this,size_t width,size_t height,Format format)

{
  undefined1 in_CL;
  undefined8 in_RDX;
  Format format_00;
  size_t in_RSI;
  nullptr_t in_RDI;
  Impl *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe0;
  nullptr_t width_00;
  
  format_00 = (Format)((ulong)in_RDX >> 0x38);
  width_00 = in_RDI;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_CL,in_stack_ffffffffffffffe0),in_RDI);
  *(undefined8 *)((long)in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)((long)in_RDI + 0x18) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d) = 0;
  reset(unaff_retaddr,(size_t)width_00,in_RSI,format_00);
  return;
}

Assistant:

explicit Impl(size_t width, size_t height, VBitmap::Format format)
        {
            reset(width, height, format);
        }